

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::RangeSink::AddVMRangeForVMAddr
          (RangeSink *this,char *analyzer,uint64_t label_from_vmaddr,uint64_t addr,uint64_t size)

{
  pointer ppVar1;
  bool verbose;
  bool bVar2;
  char *pcVar3;
  pointer ppVar4;
  string_view format;
  Arg *a2;
  string label;
  Arg local_e0;
  string local_b0;
  Arg local_90;
  Arg local_60;
  
  verbose = IsVerboseForVMRange(this,addr,size);
  if (verbose) {
    pcVar3 = GetDataSourceLabel(this->data_source_);
    printf("[%s, %s] AddVMRangeForVMAddr(%lx, [%lx, %lx])\n",pcVar3,analyzer,label_from_vmaddr,addr,
           size);
  }
  if (this->translator_ != (DualMap *)0x0) {
    ppVar1 = (this->outputs_).
             super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar4 = (this->outputs_).
                  super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1)
    {
      label._M_dataplus._M_p = (pointer)&label.field_2;
      label._M_string_length = 0;
      label.field_2._M_local_buf[0] = '\0';
      bVar2 = RangeMap::TryGetLabel(&ppVar4->first->vm_map,label_from_vmaddr,&label);
      if (bVar2) {
        a2 = (Arg *)&ppVar4->first->file_map;
        bVar2 = RangeMap::AddRangeWithTranslation
                          (&ppVar4->first->vm_map,addr,size,&label,&this->translator_->vm_map,
                           verbose,(RangeMap *)a2);
        if (!bVar2 && 1 < verbose_level) {
          absl::substitute_internal::Arg::Arg(&local_90,addr);
          absl::substitute_internal::Arg::Arg(&local_60,size);
          local_e0.piece_._M_len = label._M_string_length;
          local_e0.piece_._M_str = label._M_dataplus._M_p;
          format._M_str = (char *)&local_90;
          format._M_len = (size_t)"VM range ($0, $1) for label $2 extends beyond base map";
          absl::Substitute_abi_cxx11_(&local_b0,(absl *)0x36,format,&local_60,&local_e0,a2);
          printf("WARNING: %s\n",local_b0._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_b0);
        }
      }
      else if (1 < verbose_level) {
        printf("No label found for vmaddr %lx\n",label_from_vmaddr);
      }
      std::__cxx11::string::~string((string *)&label);
    }
    return;
  }
  __assert_fail("translator_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                0x4f1,
                "void bloaty::RangeSink::AddVMRangeForVMAddr(const char *, uint64_t, uint64_t, uint64_t)"
               );
}

Assistant:

void RangeSink::AddVMRangeForVMAddr(const char* analyzer,
                                    uint64_t label_from_vmaddr, uint64_t addr,
                                    uint64_t size) {
  bool verbose = IsVerboseForVMRange(addr, size);
  if (verbose) {
    printf("[%s, %s] AddVMRangeForVMAddr(%" PRIx64 ", [%" PRIx64 ", %" PRIx64
           "])\n",
           GetDataSourceLabel(data_source_), analyzer, label_from_vmaddr, addr,
           size);
  }
  assert(translator_);
  for (auto& pair : outputs_) {
    std::string label;
    if (pair.first->vm_map.TryGetLabel(label_from_vmaddr, &label)) {
      bool ok = pair.first->vm_map.AddRangeWithTranslation(
          addr, size, label, translator_->vm_map, verbose,
          &pair.first->file_map);
      if (!ok && verbose_level > 1) {
        WARN("VM range ($0, $1) for label $2 extends beyond base map", addr,
             size, label);
      }
    } else if (verbose_level > 1) {
      printf("No label found for vmaddr %" PRIx64 "\n", label_from_vmaddr);
    }
  }
}